

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_JoinerSetport_Test::~InterpreterTestSuite_PC_JoinerSetport_Test
          (InterpreterTestSuite_PC_JoinerSetport_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_JoinerSetport)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, SetJoinerUdpPort(JoinerType::kMeshCoP, 2001))
        .WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("joiner setport meshcop 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}